

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

context_reg_rw_t find_context_reg_rw(uc_arch arch,uc_mode mode)

{
  code *pcVar1;
  code *pcVar2;
  bool bVar3;
  context_reg_rw_t cVar4;
  context_reg_rw_t cVar5;
  context_reg_rw_t cVar6;
  context_reg_rw_t cVar7;
  context_reg_rw_t cVar8;
  context_reg_rw_t cVar9;
  context_reg_rw_t cVar10;
  context_reg_rw_t cVar11;
  context_reg_rw_t cVar12;
  context_reg_rw_t cVar13;
  context_reg_rw_t cVar14;
  context_reg_rw_t cVar15;
  context_reg_rw_t cVar16;
  
  switch(arch) {
  case UC_ARCH_ARM:
    cVar4.write = reg_write_arm;
    cVar4.read = reg_read_arm;
    return cVar4;
  case UC_ARCH_ARM64:
    cVar10.write = reg_write_aarch64;
    cVar10.read = reg_read_aarch64;
    return cVar10;
  case UC_ARCH_MIPS:
    if ((mode >> 0x1e & 1) == 0) {
      bVar3 = (mode & UC_MODE_32) != UC_MODE_ARM;
      pcVar1 = default_reg_read;
      if (bVar3) {
        pcVar1 = reg_read_mipsel;
      }
      pcVar2 = default_reg_write;
      if (bVar3) {
        pcVar2 = reg_write_mipsel;
      }
      if ((mode & UC_MODE_64) != UC_MODE_ARM) {
        cVar7.write = reg_write_mips64el;
        cVar7.read = reg_read_mips64el;
        return cVar7;
      }
    }
    else {
      bVar3 = (mode & UC_MODE_32) != UC_MODE_ARM;
      pcVar1 = default_reg_read;
      if (bVar3) {
        pcVar1 = reg_read_mips;
      }
      pcVar2 = default_reg_write;
      if (bVar3) {
        pcVar2 = reg_write_mips;
      }
      if ((mode & UC_MODE_64) != UC_MODE_ARM) {
        cVar15.write = reg_write_mips64;
        cVar15.read = reg_read_mips64;
        return cVar15;
      }
    }
    break;
  case UC_ARCH_X86:
    cVar8.write = reg_write_x86_64;
    cVar8.read = reg_read_x86_64;
    return cVar8;
  case UC_ARCH_PPC:
    bVar3 = (mode & UC_MODE_64) == UC_MODE_ARM;
    pcVar1 = reg_read_ppc64;
    if (bVar3) {
      pcVar1 = reg_read_ppc;
    }
    pcVar2 = reg_write_ppc64;
    if (bVar3) {
      pcVar2 = reg_write_ppc;
    }
    cVar5.write = pcVar2;
    cVar5.read = pcVar1;
    return cVar5;
  case UC_ARCH_SPARC:
    bVar3 = (mode & UC_MODE_64) == UC_MODE_ARM;
    pcVar1 = reg_read_sparc64;
    if (bVar3) {
      pcVar1 = reg_read_sparc;
    }
    pcVar2 = reg_write_sparc64;
    if (bVar3) {
      pcVar2 = reg_write_sparc;
    }
    cVar11.write = pcVar2;
    cVar11.read = pcVar1;
    return cVar11;
  case UC_ARCH_M68K:
    cVar12.write = reg_write_m68k;
    cVar12.read = reg_read_m68k;
    return cVar12;
  case UC_ARCH_RISCV:
    if ((mode & UC_MODE_32) != UC_MODE_ARM) {
      cVar16.write = reg_write_riscv32;
      cVar16.read = reg_read_riscv32;
      return cVar16;
    }
    bVar3 = (mode & UC_MODE_64) != UC_MODE_ARM;
    pcVar1 = default_reg_read;
    if (bVar3) {
      pcVar1 = reg_read_riscv64;
    }
    pcVar2 = default_reg_write;
    if (bVar3) {
      pcVar2 = reg_write_riscv64;
    }
    cVar9.write = pcVar2;
    cVar9.read = pcVar1;
    return cVar9;
  case UC_ARCH_S390X:
    cVar14.write = reg_write_s390x;
    cVar14.read = reg_read_s390x;
    return cVar14;
  case UC_ARCH_TRICORE:
    cVar6.write = reg_write_tricore;
    cVar6.read = reg_read_tricore;
    return cVar6;
  default:
    pcVar2 = default_reg_write;
    pcVar1 = default_reg_read;
  }
  cVar13.write = pcVar2;
  cVar13.read = pcVar1;
  return cVar13;
}

Assistant:

static context_reg_rw_t find_context_reg_rw(uc_arch arch, uc_mode mode)
{
    // We believe that the arch/mode pair is correct.
    context_reg_rw_t rw = {default_reg_read, default_reg_write};
    switch (arch) {
    default:
        break;
#ifdef UNICORN_HAS_M68K
    case UC_ARCH_M68K:
        rw.read = reg_read_m68k;
        rw.write = reg_write_m68k;
        break;
#endif
#ifdef UNICORN_HAS_X86
    case UC_ARCH_X86:
        rw.read = reg_read_x86_64;
        rw.write = reg_write_x86_64;
        break;
#endif
#ifdef UNICORN_HAS_ARM
    case UC_ARCH_ARM:
        rw.read = reg_read_arm;
        rw.write = reg_write_arm;
        break;
#endif
#ifdef UNICORN_HAS_ARM64
    case UC_ARCH_ARM64:
        rw.read = reg_read_aarch64;
        rw.write = reg_write_aarch64;
        break;
#endif

#if defined(UNICORN_HAS_MIPS) || defined(UNICORN_HAS_MIPSEL) ||                \
    defined(UNICORN_HAS_MIPS64) || defined(UNICORN_HAS_MIPS64EL)
    case UC_ARCH_MIPS:
        if (mode & UC_MODE_BIG_ENDIAN) {
#ifdef UNICORN_HAS_MIPS
            if (mode & UC_MODE_MIPS32) {
                rw.read = reg_read_mips;
                rw.write = reg_write_mips;
            }
#endif
#ifdef UNICORN_HAS_MIPS64
            if (mode & UC_MODE_MIPS64) {
                rw.read = reg_read_mips64;
                rw.write = reg_write_mips64;
            }
#endif
        } else { // little endian
#ifdef UNICORN_HAS_MIPSEL
            if (mode & UC_MODE_MIPS32) {
                rw.read = reg_read_mipsel;
                rw.write = reg_write_mipsel;
            }
#endif
#ifdef UNICORN_HAS_MIPS64EL
            if (mode & UC_MODE_MIPS64) {
                rw.read = reg_read_mips64el;
                rw.write = reg_write_mips64el;
            }
#endif
        }
        break;
#endif

#ifdef UNICORN_HAS_SPARC
    case UC_ARCH_SPARC:
        if (mode & UC_MODE_SPARC64) {
            rw.read = reg_read_sparc64;
            rw.write = reg_write_sparc64;
        } else {
            rw.read = reg_read_sparc;
            rw.write = reg_write_sparc;
        }
        break;
#endif
#ifdef UNICORN_HAS_PPC
    case UC_ARCH_PPC:
        if (mode & UC_MODE_PPC64) {
            rw.read = reg_read_ppc64;
            rw.write = reg_write_ppc64;
        } else {
            rw.read = reg_read_ppc;
            rw.write = reg_write_ppc;
        }
        break;
#endif
#ifdef UNICORN_HAS_RISCV
    case UC_ARCH_RISCV:
        if (mode & UC_MODE_RISCV32) {
            rw.read = reg_read_riscv32;
            rw.write = reg_write_riscv32;
        } else if (mode & UC_MODE_RISCV64) {
            rw.read = reg_read_riscv64;
            rw.write = reg_write_riscv64;
        }
        break;
#endif
#ifdef UNICORN_HAS_S390X
    case UC_ARCH_S390X:
        rw.read = reg_read_s390x;
        rw.write = reg_write_s390x;
        break;
#endif
#ifdef UNICORN_HAS_TRICORE
    case UC_ARCH_TRICORE:
        rw.read = reg_read_tricore;
        rw.write = reg_write_tricore;
        break;
#endif
    }

    return rw;
}